

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall kj::ArrayBuilder<kj::String>::~ArrayBuilder(ArrayBuilder<kj::String> *this)

{
  String *pSVar1;
  RemoveConst<kj::String> *pRVar2;
  String *pSVar3;
  
  pSVar1 = this->ptr;
  if (pSVar1 != (String *)0x0) {
    pRVar2 = this->pos;
    pSVar3 = this->endPtr;
    this->ptr = (String *)0x0;
    this->pos = (RemoveConst<kj::String> *)0x0;
    this->endPtr = (String *)0x0;
    (*(code *)**(undefined8 **)this->disposer)
              (this->disposer,pSVar1,0x18,((long)pRVar2 - (long)pSVar1 >> 3) * -0x5555555555555555,
               ((long)pSVar3 - (long)pSVar1 >> 3) * -0x5555555555555555,
               ArrayDisposer::Dispose_<kj::String>::destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }